

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdStoreLane<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  bool bVar1;
  undefined8 uVar2;
  pointer puVar3;
  Store *this_00;
  Memory *pMVar4;
  ulong uVar5;
  ulong uVar6;
  RunResult RVar7;
  ulong uVar8;
  Value VVar9;
  Simd<unsigned_long,_(unsigned_char)__x02_> result;
  RefPtr<wabt::interp::Memory> local_98;
  anon_union_16_6_113bff37_for_Value_0 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_98,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  local_78.v128_.v = (v128)Pop(this);
  pMVar4 = local_98.obj_;
  uVar2 = *(undefined8 *)((long)&local_78 + (ulong)instr.field_2.imm_v128.v[8] * 8);
  bVar1 = ((local_98.obj_)->type_).limits.is_64;
  VVar9 = Pop(this);
  uVar6 = (ulong)VVar9.field_0.i32_;
  if (bVar1 != false) {
    uVar6 = VVar9.field_0.i64_;
  }
  uVar5 = (ulong)instr.field_2.imm_u32x2.snd;
  puVar3 = (pMVar4->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar8 = (long)(pMVar4->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  if ((((uVar8 < 8) || (uVar8 < uVar6)) || (uVar8 < uVar5)) || (uVar8 < uVar6 + uVar5 + 8)) {
    this_00 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_68,"out of bounds memory access: access at %lu+%zd >= max value %lu",
               uVar6 + uVar5,8,
               (long)((local_98.obj_)->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)((local_98.obj_)->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar7 = Trap;
  }
  else {
    *(undefined8 *)(puVar3 + uVar5 + uVar6) = uVar2;
    RVar7 = Ok;
  }
  if (local_98.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_98.store_,local_98.root_index_);
  }
  return RVar7;
}

Assistant:

RunResult Thread::DoSimdStoreLane(Instr instr, Trap::Ptr* out_trap) {
  using T = typename S::LaneType;
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2_u8.fst]};
  auto result = Pop<S>();
  T val = result[instr.imm_u32x2_u8.idx];
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->Store(offset, instr.imm_u32x2_u8.snd, val)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %" PRIu64,
                       offset + instr.imm_u32x2_u8.snd, sizeof(T),
                       memory->ByteSize()));
  return RunResult::Ok;
}